

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

hts_itr_t * sam_itr_queryi(hts_idx_t *idx,int tid,int beg,int end)

{
  hts_cram_idx_t *cidx;
  int end_local;
  int beg_local;
  int tid_local;
  hts_idx_t *idx_local;
  
  if (idx == (hts_idx_t *)0x0) {
    idx_local = (hts_idx_t *)hts_itr_query((hts_idx_t *)0x0,tid,beg,end,sam_bam_cram_readrec);
  }
  else if (idx->fmt == 3) {
    idx_local = (hts_idx_t *)cram_itr_query(idx,tid,beg,end,cram_readrec);
  }
  else {
    idx_local = (hts_idx_t *)hts_itr_query(idx,tid,beg,end,bam_readrec);
  }
  return (hts_itr_t *)idx_local;
}

Assistant:

hts_itr_t *sam_itr_queryi(const hts_idx_t *idx, int tid, int beg, int end)
{
    const hts_cram_idx_t *cidx = (const hts_cram_idx_t *) idx;
    if (idx == NULL)
        return hts_itr_query(NULL, tid, beg, end, sam_bam_cram_readrec);
    else if (cidx->fmt == HTS_FMT_CRAI)
        return cram_itr_query(idx, tid, beg, end, cram_readrec);
    else
        return hts_itr_query(idx, tid, beg, end, bam_readrec);
}